

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

int xmlStreamPushInternal(xmlStreamCtxtPtr stream,xmlChar *name,xmlChar *ns,int nodeType)

{
  long lVar1;
  ulong uVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  int iVar5;
  int iVar6;
  ulong *puVar7;
  uint local_78;
  xmlStreamStep step;
  xmlStreamCompPtr comp;
  int local_48;
  int desc;
  int stepNr;
  int match;
  int m;
  int i;
  int tmp;
  int final;
  int ret;
  int nodeType_local;
  xmlChar *ns_local;
  xmlChar *name_local;
  xmlStreamCtxtPtr stream_local;
  
  tmp = 0;
  i = 0;
  if ((stream == (xmlStreamCtxtPtr)0x0) || (name_local = (xmlChar *)stream, stream->nbState < 0)) {
    return -1;
  }
  do {
    while( true ) {
      while( true ) {
        if (name_local == (xmlChar *)0x0) {
          return tmp;
        }
        lVar1 = *(long *)(name_local + 8);
        if (((nodeType != 1) || (name != (xmlChar *)0x0)) || (ns != (xmlChar *)0x0)) break;
        name_local[0x10] = '\0';
        name_local[0x11] = '\0';
        name_local[0x12] = '\0';
        name_local[0x13] = '\0';
        name_local[0x18] = '\0';
        name_local[0x19] = '\0';
        name_local[0x1a] = '\0';
        name_local[0x1b] = '\0';
        name_local[0x2c] = 0xff;
        name_local[0x2d] = 0xff;
        name_local[0x2e] = 0xff;
        name_local[0x2f] = 0xff;
        if ((*(uint *)(lVar1 + 0x18) & 0x8000) != 0) {
          if (*(int *)(lVar1 + 8) == 0) {
            tmp = 1;
          }
          else if (((*(int *)(lVar1 + 8) == 1) && (*(int *)(*(long *)(lVar1 + 0x10) + 0x18) == 100))
                  && ((**(uint **)(lVar1 + 0x10) & 1) != 0)) {
            tmp = 1;
          }
          else if (((**(uint **)(lVar1 + 0x10) & 4) != 0) &&
                  (iVar5 = xmlStreamCtxtAddState((xmlStreamCtxtPtr)name_local,0,0), iVar5 < 0)) {
            return -1;
          }
        }
        name_local = *(xmlChar **)name_local;
      }
      if (*(int *)(lVar1 + 8) == 0) break;
      if (*(int *)(name_local + 0x2c) == -1) {
        if (((nodeType == 1) || (nodeType == 2)) || ((*(uint *)(lVar1 + 0x18) & 0x4000) != 0)) {
          match = 0;
          iVar5 = *(int *)(name_local + 0x10);
          for (; match < iVar5; match = match + 1) {
            if ((*(uint *)(lVar1 + 0x18) & 0x10000) == 0) {
              local_48 = *(int *)(*(long *)(name_local + 0x20) +
                                 (long)((*(int *)(name_local + 0x10) + -1) * 2) * 4);
              match = iVar5;
              if (*(int *)(*(long *)(name_local + 0x20) +
                          (long)((*(int *)(name_local + 0x10) + -1) * 2 + 1) * 4) <
                  *(int *)(name_local + 0x18)) {
                return -1;
              }
LAB_001a1902:
              puVar7 = (ulong *)(*(long *)(lVar1 + 0x10) + (long)local_48 * 0x20);
              uVar2 = *puVar7;
              pxVar3 = (xmlChar *)puVar7[1];
              pxVar4 = (xmlChar *)puVar7[2];
              step.ns._0_4_ = (int)puVar7[3];
              if ((int)step.ns == nodeType) {
LAB_001a1978:
                desc = 0;
                if ((int)step.ns == 100) {
                  desc = 1;
                }
                else if (pxVar3 == (xmlChar *)0x0) {
                  if (pxVar4 == (xmlChar *)0x0) {
                    desc = 1;
                  }
                  else if (ns != (xmlChar *)0x0) {
                    desc = xmlStrEqual(pxVar4,ns);
                  }
                }
                else if ((((((pxVar4 != (xmlChar *)0x0) == (ns != (xmlChar *)0x0)) &&
                           (name != (xmlChar *)0x0)) && (*pxVar3 == *name)) &&
                         (iVar6 = xmlStrEqual(pxVar3,name), iVar6 != 0)) &&
                        ((pxVar4 == ns || (iVar6 = xmlStrEqual(pxVar4,ns), iVar6 != 0)))) {
                  desc = 1;
                }
                if (desc != 0) {
                  local_78 = (uint)uVar2;
                  i = local_78 & 2;
                  if ((uVar2 & 2) == 0) {
                    iVar6 = xmlStreamCtxtAddState
                                      ((xmlStreamCtxtPtr)name_local,local_48 + 1,
                                       *(int *)(name_local + 0x18) + 1);
                    if (iVar6 < 0) {
                      return -1;
                    }
                  }
                  else {
                    tmp = 1;
                  }
                  if ((tmp != 1) && ((uVar2 & 0x20) != 0)) {
                    tmp = 1;
                  }
                }
                if (((*(uint *)(lVar1 + 0x18) & 0x10000) == 0) && ((desc == 0 || (i != 0)))) {
                  *(int *)(name_local + 0x2c) = *(int *)(name_local + 0x18) + 1;
                }
              }
              else if ((int)step.ns == 2) {
                if ((*(uint *)(lVar1 + 0x18) & 0x10000) == 0) {
                  *(int *)(name_local + 0x2c) = *(int *)(name_local + 0x18) + 1;
                }
              }
              else if ((int)step.ns == 100) goto LAB_001a1978;
            }
            else {
              local_48 = *(int *)(*(long *)(name_local + 0x20) + (long)(match << 1) * 4);
              if (((-1 < local_48) &&
                  (iVar6 = *(int *)(*(long *)(name_local + 0x20) + (long)(match * 2 + 1) * 4),
                  iVar6 <= *(int *)(name_local + 0x18))) &&
                 ((*(int *)(name_local + 0x18) <= iVar6 ||
                  ((*(uint *)(*(long *)(lVar1 + 0x10) + (long)local_48 * 0x20) & 1) != 0))))
              goto LAB_001a1902;
            }
          }
          *(int *)(name_local + 0x18) = *(int *)(name_local + 0x18) + 1;
          puVar7 = *(ulong **)(lVar1 + 0x10);
          uVar2 = *puVar7;
          pxVar3 = (xmlChar *)puVar7[1];
          pxVar4 = (xmlChar *)puVar7[2];
          local_78 = (uint)uVar2;
          if ((uVar2 & 4) == 0) {
            if ((*(uint *)(name_local + 0x28) & 7) == 0) {
LAB_001a1b7c:
              step.ns._0_4_ = (int)puVar7[3];
              if (((int)step.ns == nodeType) || ((nodeType != 2 && ((int)step.ns == 100)))) {
                desc = 0;
                if ((int)step.ns == 100) {
                  desc = 1;
                }
                else if (pxVar3 == (xmlChar *)0x0) {
                  if (pxVar4 == (xmlChar *)0x0) {
                    desc = 1;
                  }
                  else if (ns != (xmlChar *)0x0) {
                    desc = xmlStrEqual(pxVar4,ns);
                  }
                }
                else if (((((pxVar4 != (xmlChar *)0x0) == (ns != (xmlChar *)0x0)) &&
                          (name != (xmlChar *)0x0)) && (*pxVar3 == *name)) &&
                        ((iVar5 = xmlStrEqual(pxVar3,name), iVar5 != 0 &&
                         ((pxVar4 == ns || (iVar5 = xmlStrEqual(pxVar4,ns), iVar5 != 0)))))) {
                  desc = 1;
                }
                i = local_78 & 2;
                if (desc != 0) {
                  if ((uVar2 & 2) == 0) {
                    iVar5 = xmlStreamCtxtAddState
                                      ((xmlStreamCtxtPtr)name_local,1,*(int *)(name_local + 0x18));
                    if (iVar5 < 0) {
                      return -1;
                    }
                  }
                  else {
                    tmp = 1;
                  }
                  if ((tmp != 1) && ((uVar2 & 0x20) != 0)) {
                    tmp = 1;
                  }
                }
                if (((*(uint *)(lVar1 + 0x18) & 0x10000) == 0) &&
                   ((desc == 0 || ((uVar2 & 2) != 0)))) {
                  *(undefined4 *)(name_local + 0x2c) = *(undefined4 *)(name_local + 0x18);
                }
              }
            }
            else if (*(int *)(name_local + 0x18) == 1) {
              if ((*(uint *)(name_local + 0x28) & 6) == 0) goto LAB_001a1b7c;
            }
            else if (((uVar2 & 1) != 0) ||
                    ((*(int *)(name_local + 0x18) == 2 && ((*(uint *)(name_local + 0x28) & 6) != 0))
                    )) goto LAB_001a1b7c;
          }
        }
        else {
          *(int *)(name_local + 0x18) = *(int *)(name_local + 0x18) + 1;
        }
      }
      else {
        *(int *)(name_local + 0x18) = *(int *)(name_local + 0x18) + 1;
      }
LAB_001a1ce4:
      name_local = *(xmlChar **)name_local;
    }
    if ((*(uint *)(name_local + 0x28) & 1) == 0) {
      if ((nodeType != 2) &&
         (((*(uint *)(name_local + 0x28) & 7) == 0 || (*(int *)(name_local + 0x18) == 0)))) {
        tmp = 1;
      }
      *(int *)(name_local + 0x18) = *(int *)(name_local + 0x18) + 1;
      goto LAB_001a1ce4;
    }
    name_local = *(xmlChar **)name_local;
  } while( true );
}

Assistant:

static int
xmlStreamPushInternal(xmlStreamCtxtPtr stream,
		      const xmlChar *name, const xmlChar *ns,
		      int nodeType) {
    int ret = 0, final = 0, tmp, i, m, match, stepNr, desc;
    xmlStreamCompPtr comp;
    xmlStreamStep step;

    if ((stream == NULL) || (stream->nbState < 0))
        return(-1);

    while (stream != NULL) {
	comp = stream->comp;

	if ((nodeType == XML_ELEMENT_NODE) &&
	    (name == NULL) && (ns == NULL)) {
	    /* We have a document node here (or a reset). */
	    stream->nbState = 0;
	    stream->level = 0;
	    stream->blockLevel = -1;
	    if (comp->flags & XML_STREAM_FROM_ROOT) {
		if (comp->nbStep == 0) {
		    /* TODO: We have a "/." here? */
		    ret = 1;
		} else {
		    if ((comp->nbStep == 1) &&
			(comp->steps[0].nodeType == XML_STREAM_ANY_NODE) &&
			(comp->steps[0].flags & XML_STREAM_STEP_DESC))
		    {
			/*
			* In the case of "//." the document node will match
			* as well.
			*/
			ret = 1;
		    } else if (comp->steps[0].flags & XML_STREAM_STEP_ROOT) {
			if (xmlStreamCtxtAddState(stream, 0, 0) < 0)
                            return(-1);
		    }
		}
	    }
	    stream = stream->next;
	    continue; /* while */
	}

	/*
	* Fast check for ".".
	*/
	if (comp->nbStep == 0) {
	    /*
	     * / and . are handled at the XPath node set creation
	     * level by checking min depth
	     */
	    if (stream->flags & XML_PATTERN_XPATH) {
		stream = stream->next;
		continue; /* while */
	    }
	    /*
	    * For non-pattern like evaluation like XML Schema IDCs
	    * or traditional XPath expressions, this will match if
	    * we are at the first level only, otherwise on every level.
	    */
	    if ((nodeType != XML_ATTRIBUTE_NODE) &&
		(((stream->flags & XML_PATTERN_NOTPATTERN) == 0) ||
		(stream->level == 0))) {
		    ret = 1;
	    }
	    stream->level++;
	    goto stream_next;
	}
	if (stream->blockLevel != -1) {
	    /*
	    * Skip blocked expressions.
	    */
	    stream->level++;
	    goto stream_next;
	}

	if ((nodeType != XML_ELEMENT_NODE) &&
	    (nodeType != XML_ATTRIBUTE_NODE) &&
	    ((comp->flags & XML_STREAM_FINAL_IS_ANY_NODE) == 0)) {
	    /*
	    * No need to process nodes of other types if we don't
	    * resolve to those types.
	    * TODO: Do we need to block the context here?
	    */
	    stream->level++;
	    goto stream_next;
	}

	/*
	 * Check evolution of existing states
	 */
	i = 0;
	m = stream->nbState;
	while (i < m) {
	    if ((comp->flags & XML_STREAM_DESC) == 0) {
		/*
		* If there is no "//", then only the last
		* added state is of interest.
		*/
		stepNr = stream->states[2 * (stream->nbState -1)];
		/*
		* TODO: Security check, should not happen, remove it.
		*/
		if (stream->states[(2 * (stream->nbState -1)) + 1] <
		    stream->level) {
		    return (-1);
		}
		desc = 0;
		/* loop-stopper */
		i = m;
	    } else {
		/*
		* If there are "//", then we need to process every "//"
		* occurring in the states, plus any other state for this
		* level.
		*/
		stepNr = stream->states[2 * i];

		/* TODO: should not happen anymore: dead states */
		if (stepNr < 0)
		    goto next_state;

		tmp = stream->states[(2 * i) + 1];

		/* skip new states just added */
		if (tmp > stream->level)
		    goto next_state;

		/* skip states at ancestor levels, except if "//" */
		desc = comp->steps[stepNr].flags & XML_STREAM_STEP_DESC;
		if ((tmp < stream->level) && (!desc))
		    goto next_state;
	    }
	    /*
	    * Check for correct node-type.
	    */
	    step = comp->steps[stepNr];
	    if (step.nodeType != nodeType) {
		if (step.nodeType == XML_ATTRIBUTE_NODE) {
		    /*
		    * Block this expression for deeper evaluation.
		    */
		    if ((comp->flags & XML_STREAM_DESC) == 0)
			stream->blockLevel = stream->level +1;
		    goto next_state;
		} else if (step.nodeType != XML_STREAM_ANY_NODE)
		    goto next_state;
	    }
	    /*
	    * Compare local/namespace-name.
	    */
	    match = 0;
	    if (step.nodeType == XML_STREAM_ANY_NODE) {
		match = 1;
	    } else if (step.name == NULL) {
		if (step.ns == NULL) {
		    /*
		    * This lets through all elements/attributes.
		    */
		    match = 1;
		} else if (ns != NULL)
		    match = xmlStrEqual(step.ns, ns);
	    } else if (((step.ns != NULL) == (ns != NULL)) &&
		(name != NULL) &&
		(step.name[0] == name[0]) &&
		xmlStrEqual(step.name, name) &&
		((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	    {
		match = 1;
	    }
	    if (match) {
		final = step.flags & XML_STREAM_STEP_FINAL;
                if (final) {
                    ret = 1;
                } else if (xmlStreamCtxtAddState(stream, stepNr + 1,
                                                 stream->level + 1) < 0) {
                    return(-1);
                }
		if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		    /*
		    * Check if we have a special case like "foo/bar//.", where
		    * "foo" is selected as well.
		    */
		    ret = 1;
		}
	    }
	    if (((comp->flags & XML_STREAM_DESC) == 0) &&
		((! match) || final))  {
		/*
		* Mark this expression as blocked for any evaluation at
		* deeper levels. Note that this includes "/foo"
		* expressions if the *pattern* behaviour is used.
		*/
		stream->blockLevel = stream->level +1;
	    }
next_state:
	    i++;
	}

	stream->level++;

	/*
	* Re/enter the expression.
	* Don't reenter if it's an absolute expression like "/foo",
	*   except "//foo".
	*/
	step = comp->steps[0];
	if (step.flags & XML_STREAM_STEP_ROOT)
	    goto stream_next;

	desc = step.flags & XML_STREAM_STEP_DESC;
	if (stream->flags & XML_PATTERN_NOTPATTERN) {
	    /*
	    * Re/enter the expression if it is a "descendant" one,
	    * or if we are at the 1st level of evaluation.
	    */

	    if (stream->level == 1) {
		if (XML_STREAM_XS_IDC(stream)) {
		    /*
		    * XS-IDC: The missing "self::node()" will always
		    * match the first given node.
		    */
		    goto stream_next;
		} else
		    goto compare;
	    }
	    /*
	    * A "//" is always reentrant.
	    */
	    if (desc)
		goto compare;

	    /*
	    * XS-IDC: Process the 2nd level, since the missing
	    * "self::node()" is responsible for the 2nd level being
	    * the real start level.
	    */
	    if ((stream->level == 2) && XML_STREAM_XS_IDC(stream))
		goto compare;

	    goto stream_next;
	}

compare:
	/*
	* Check expected node-type.
	*/
	if (step.nodeType != nodeType) {
	    if (nodeType == XML_ATTRIBUTE_NODE)
		goto stream_next;
	    else if (step.nodeType != XML_STREAM_ANY_NODE)
		goto stream_next;
	}
	/*
	* Compare local/namespace-name.
	*/
	match = 0;
	if (step.nodeType == XML_STREAM_ANY_NODE) {
	    match = 1;
	} else if (step.name == NULL) {
	    if (step.ns == NULL) {
		/*
		* This lets through all elements/attributes.
		*/
		match = 1;
	    } else if (ns != NULL)
		match = xmlStrEqual(step.ns, ns);
	} else if (((step.ns != NULL) == (ns != NULL)) &&
	    (name != NULL) &&
	    (step.name[0] == name[0]) &&
	    xmlStrEqual(step.name, name) &&
	    ((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	{
	    match = 1;
	}
	final = step.flags & XML_STREAM_STEP_FINAL;
	if (match) {
	    if (final) {
		ret = 1;
            } else if (xmlStreamCtxtAddState(stream, 1, stream->level) < 0) {
                return(-1);
            }
	    if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		/*
		* Check if we have a special case like "foo//.", where
		* "foo" is selected as well.
		*/
		ret = 1;
	    }
	}
	if (((comp->flags & XML_STREAM_DESC) == 0) &&
	    ((! match) || final))  {
	    /*
	    * Mark this expression as blocked for any evaluation at
	    * deeper levels.
	    */
	    stream->blockLevel = stream->level;
	}

stream_next:
        stream = stream->next;
    } /* while stream != NULL */

    return(ret);
}